

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression *
soul::ExpressionHelpers::create
          (Expression *__return_storage_ptr__,Expression *e,StringDictionary *dictionary)

{
  bool bVar1;
  SubscriptWithBrackets *pSVar2;
  SubscriptWithChevrons *pSVar3;
  DotOperator *pDVar4;
  string *psVar5;
  QualifiedIdentifier *q_00;
  Constant *pCVar6;
  TypeMetaFunction *pTVar7;
  Expression *pEVar8;
  char *__s;
  CodeLocationRange local_500;
  string local_4e0;
  string local_4c0;
  anon_class_16_2_196927f3 local_4a0;
  function<void_()> local_490;
  undefined1 local_470 [8];
  Expression result;
  string local_450;
  Expression local_430;
  allocator<char> local_411;
  string local_410;
  Expression local_3f0;
  Expression local_3d8;
  Expression local_3c0;
  Expression local_3a8;
  allocator<char> local_389;
  string local_388;
  Expression local_368;
  allocator<char> local_349;
  string local_348;
  Expression local_328;
  Expression local_310;
  pool_ptr<soul::AST::TypeMetaFunction> local_2f8;
  pool_ptr<soul::AST::TypeMetaFunction> m;
  pool_ptr<soul::AST::Constant> local_2d0;
  pool_ptr<soul::AST::Constant> c;
  pool_ptr<soul::AST::QualifiedIdentifier> q;
  Expression local_2a0;
  allocator<char> local_281;
  string local_280;
  Expression local_260;
  Expression local_248;
  Expression local_230;
  pool_ptr<soul::AST::DotOperator> local_218;
  pool_ptr<soul::AST::DotOperator> d;
  string local_208;
  Expression local_1e8;
  pool_ptr<soul::AST::Expression> local_1d0;
  Expression local_1c8;
  allocator<char> local_1a9;
  string local_1a8;
  Expression local_188;
  Expression local_170;
  Expression local_158;
  Expression local_140;
  pool_ptr<soul::AST::SubscriptWithChevrons> local_128;
  pool_ptr<soul::AST::SubscriptWithChevrons> s_1;
  string local_118;
  Expression local_f8;
  pool_ptr<soul::AST::Expression> local_e0;
  Expression local_d8;
  allocator<char> local_b9;
  string local_b8;
  Expression local_98;
  Expression local_70;
  Expression local_58;
  Expression local_40;
  pool_ptr<soul::AST::SubscriptWithBrackets> local_28;
  pool_ptr<soul::AST::SubscriptWithBrackets> s;
  StringDictionary *dictionary_local;
  Expression *e_local;
  
  s.object = (SubscriptWithBrackets *)dictionary;
  cast<soul::AST::SubscriptWithBrackets,soul::AST::Expression>((soul *)&local_28,e);
  s_1.object._0_1_ = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (s_1.object._0_1_) {
    pSVar2 = pool_ptr<soul::AST::SubscriptWithBrackets>::operator->(&local_28);
    pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pSVar2->lhs);
    create(&local_70,pEVar8,(StringDictionary *)s.object);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"[",&local_b9);
    createText(&local_98,&local_b8);
    soul::operator+(&local_58,&local_70,&local_98);
    pSVar2 = pool_ptr<soul::AST::SubscriptWithBrackets>::operator->(&local_28);
    local_e0.object = (pSVar2->rhs).object;
    createIfNotNull(&local_d8,&local_e0,(StringDictionary *)s.object);
    soul::operator+(&local_40,&local_58,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"]",(allocator<char> *)((long)&s_1.object + 7));
    createText(&local_f8,&local_118);
    soul::operator+(__return_storage_ptr__,&local_40,&local_f8);
    SourceCodeModel::Expression::~Expression(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&s_1.object + 7));
    SourceCodeModel::Expression::~Expression(&local_40);
    SourceCodeModel::Expression::~Expression(&local_d8);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_e0);
    SourceCodeModel::Expression::~Expression(&local_58);
    SourceCodeModel::Expression::~Expression(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    SourceCodeModel::Expression::~Expression(&local_70);
  }
  s_1.object._1_3_ = 0;
  pool_ptr<soul::AST::SubscriptWithBrackets>::~pool_ptr(&local_28);
  if ((uint)s_1.object == 0) {
    cast<soul::AST::SubscriptWithChevrons,soul::AST::Expression>((soul *)&local_128,e);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_128);
    if (bVar1) {
      pSVar3 = pool_ptr<soul::AST::SubscriptWithChevrons>::operator->(&local_128);
      pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pSVar3->lhs);
      create(&local_170,pEVar8,(StringDictionary *)s.object);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"<",&local_1a9);
      createText(&local_188,&local_1a8);
      soul::operator+(&local_158,&local_170,&local_188);
      pSVar3 = pool_ptr<soul::AST::SubscriptWithChevrons>::operator->(&local_128);
      local_1d0.object = (pSVar3->rhs).object;
      createIfNotNull(&local_1c8,&local_1d0,(StringDictionary *)s.object);
      soul::operator+(&local_140,&local_158,&local_1c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,">",(allocator<char> *)((long)&d.object + 7));
      createText(&local_1e8,&local_208);
      soul::operator+(__return_storage_ptr__,&local_140,&local_1e8);
      SourceCodeModel::Expression::~Expression(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)((long)&d.object + 7));
      SourceCodeModel::Expression::~Expression(&local_140);
      SourceCodeModel::Expression::~Expression(&local_1c8);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_1d0);
      SourceCodeModel::Expression::~Expression(&local_158);
      SourceCodeModel::Expression::~Expression(&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      SourceCodeModel::Expression::~Expression(&local_170);
    }
    s_1.object._1_3_ = 0;
    s_1.object._0_1_ = bVar1;
    pool_ptr<soul::AST::SubscriptWithChevrons>::~pool_ptr(&local_128);
    if ((uint)s_1.object == 0) {
      cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_218,e);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_218);
      if (bVar1) {
        pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->(&local_218);
        pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pDVar4->lhs);
        create(&local_248,pEVar8,(StringDictionary *)s.object);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,".",&local_281);
        createText(&local_260,&local_280);
        soul::operator+(&local_230,&local_248,&local_260);
        pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->(&local_218);
        psVar5 = Identifier::toString_abi_cxx11_(&pDVar4->rhs->identifier);
        std::__cxx11::string::string((string *)&q,(string *)psVar5);
        createText(&local_2a0,(string *)&q);
        soul::operator+(__return_storage_ptr__,&local_230,&local_2a0);
        SourceCodeModel::Expression::~Expression(&local_2a0);
        std::__cxx11::string::~string((string *)&q);
        SourceCodeModel::Expression::~Expression(&local_230);
        SourceCodeModel::Expression::~Expression(&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        SourceCodeModel::Expression::~Expression(&local_248);
      }
      s_1.object._1_3_ = 0;
      s_1.object._0_1_ = bVar1;
      pool_ptr<soul::AST::DotOperator>::~pool_ptr(&local_218);
      if ((uint)s_1.object == 0) {
        cast<soul::AST::QualifiedIdentifier,soul::AST::Expression>((soul *)&c,e);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&c);
        if (bVar1) {
          q_00 = pool_ptr<soul::AST::QualifiedIdentifier>::operator*
                           ((pool_ptr<soul::AST::QualifiedIdentifier> *)&c);
          fromIdentifier(__return_storage_ptr__,q_00);
        }
        s_1.object._1_3_ = 0;
        s_1.object._0_1_ = bVar1;
        pool_ptr<soul::AST::QualifiedIdentifier>::~pool_ptr
                  ((pool_ptr<soul::AST::QualifiedIdentifier> *)&c);
        if ((uint)s_1.object == 0) {
          cast<soul::AST::Constant,soul::AST::Expression>((soul *)&local_2d0,e);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_2d0);
          if (bVar1) {
            pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_2d0);
            soul::Value::getDescription_abi_cxx11_
                      ((string *)&m,&pCVar6->value,(StringDictionary *)s.object);
            createText(__return_storage_ptr__,(string *)&m);
            std::__cxx11::string::~string((string *)&m);
          }
          s_1.object._1_3_ = 0;
          s_1.object._0_1_ = bVar1;
          pool_ptr<soul::AST::Constant>::~pool_ptr(&local_2d0);
          if ((uint)s_1.object == 0) {
            cast<soul::AST::TypeMetaFunction,soul::AST::Expression>((soul *)&local_2f8,e);
            bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_2f8);
            if (bVar1) {
              pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
              if (pTVar7->operation == makeReference) {
                pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
                pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pTVar7->source);
                create(&local_310,pEVar8,(StringDictionary *)s.object);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_348,"&",&local_349);
                createText(&local_328,&local_348);
                soul::operator+(__return_storage_ptr__,&local_310,&local_328);
                SourceCodeModel::Expression::~Expression(&local_328);
                std::__cxx11::string::~string((string *)&local_348);
                std::allocator<char>::~allocator(&local_349);
                SourceCodeModel::Expression::~Expression(&local_310);
                s_1.object._0_4_ = 1;
              }
              else {
                pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
                if (pTVar7->operation == makeConst) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_388,"const ",&local_389);
                  createKeyword(&local_368,&local_388);
                  pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
                  pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pTVar7->source);
                  create(&local_3a8,pEVar8,(StringDictionary *)s.object);
                  soul::operator+(__return_storage_ptr__,&local_368,&local_3a8);
                  SourceCodeModel::Expression::~Expression(&local_3a8);
                  SourceCodeModel::Expression::~Expression(&local_368);
                  std::__cxx11::string::~string((string *)&local_388);
                  std::allocator<char>::~allocator(&local_389);
                  s_1.object._0_4_ = 1;
                }
                else {
                  pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
                  pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pTVar7->source);
                  create(&local_3d8,pEVar8,(StringDictionary *)s.object);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_410,".",&local_411);
                  createText(&local_3f0,&local_410);
                  soul::operator+(&local_3c0,&local_3d8,&local_3f0);
                  pTVar7 = pool_ptr<soul::AST::TypeMetaFunction>::operator->(&local_2f8);
                  __s = AST::TypeMetaFunction::getNameForOperation(pTVar7->operation);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_450,__s,
                             (allocator<char> *)
                             ((long)&result.sections.
                                     super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  createText(&local_430,&local_450);
                  soul::operator+(__return_storage_ptr__,&local_3c0,&local_430);
                  SourceCodeModel::Expression::~Expression(&local_430);
                  std::__cxx11::string::~string((string *)&local_450);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&result.sections.
                                     super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  SourceCodeModel::Expression::~Expression(&local_3c0);
                  SourceCodeModel::Expression::~Expression(&local_3f0);
                  std::__cxx11::string::~string((string *)&local_410);
                  std::allocator<char>::~allocator(&local_411);
                  SourceCodeModel::Expression::~Expression(&local_3d8);
                  s_1.object._0_4_ = 1;
                }
              }
            }
            else {
              s_1.object._0_4_ = 0;
            }
            pool_ptr<soul::AST::TypeMetaFunction>::~pool_ptr(&local_2f8);
            if ((uint)s_1.object == 0) {
              SourceCodeModel::Expression::Expression((Expression *)local_470);
              local_4a0.result = (Expression *)local_470;
              local_4a0.e = e;
              std::function<void()>::
              function<soul::ExpressionHelpers::create(soul::AST::Expression&,soul::StringDictionary_const&)::_lambda()_1_,void>
                        ((function<void()> *)&local_490,&local_4a0);
              catchParseErrors(&local_490);
              std::function<void_()>::~function(&local_490);
              bVar1 = std::
                      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                      ::empty((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                               *)local_470);
              if (bVar1) {
                SourceCodeUtilities::findRangeOfASTObject(&local_500,(ASTObject *)e);
                CodeLocationRange::toString_abi_cxx11_(&local_4e0,&local_500);
                choc::text::trim(&local_4c0,&local_4e0);
                createText(__return_storage_ptr__,&local_4c0);
                std::__cxx11::string::~string((string *)&local_4c0);
                std::__cxx11::string::~string((string *)&local_4e0);
                CodeLocationRange::~CodeLocationRange(&local_500);
              }
              else {
                SourceCodeModel::Expression::Expression
                          (__return_storage_ptr__,(Expression *)local_470);
              }
              s_1.object._0_4_ = 1;
              SourceCodeModel::Expression::~Expression((Expression *)local_470);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (AST::Expression& e, const StringDictionary& dictionary)
    {
        if (auto s = cast<AST::SubscriptWithBrackets> (e))  return create (s->lhs, dictionary) + createText ("[") + createIfNotNull (s->rhs, dictionary) + createText ("]");
        if (auto s = cast<AST::SubscriptWithChevrons> (e))  return create (s->lhs, dictionary) + createText ("<") + createIfNotNull (s->rhs, dictionary) + createText (">");
        if (auto d = cast<AST::DotOperator> (e))            return create (d->lhs, dictionary) + createText (".") + createText (d->rhs.identifier.toString());
        if (auto q = cast<AST::QualifiedIdentifier> (e))    return fromIdentifier (*q);
        if (auto c = cast<AST::Constant> (e))               return createText (c->value.getDescription (std::addressof (dictionary)));

        if (auto m = cast<AST::TypeMetaFunction> (e))
        {
            if (m->operation == AST::TypeMetaFunction::Op::makeReference)
                return create (m->source, dictionary) + createText ("&");

            if (m->operation == AST::TypeMetaFunction::Op::makeConst)
                return createKeyword ("const ") + create (m->source, dictionary);

            return create (m->source, dictionary) + createText (".") + createText (AST::TypeMetaFunction::getNameForOperation (m->operation));
        }

        SourceCodeModel::Expression result;
        catchParseErrors ([&] { result = create (e.resolveAsType()); });

        if (! result.sections.empty())
            return result;

        return createText (choc::text::trim (SourceCodeUtilities::findRangeOfASTObject (e).toString()));
    }